

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflection_IsDescendantExtension_Test::
~GeneratedMessageReflection_IsDescendantExtension_Test
          (GeneratedMessageReflection_IsDescendantExtension_Test *this)

{
  GeneratedMessageReflection_IsDescendantExtension_Test *this_local;
  
  ~GeneratedMessageReflection_IsDescendantExtension_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratedMessageReflection, IsDescendantExtension) {
  unittest::TestAllExtensions msg1, msg2;
  TestUtil::SetAllExtensions(&msg1);
  msg2 = msg1;

  EXPECT_TRUE(IsDescendant(
      msg1, msg1.GetExtension(unittest::optional_nested_message_extension)));
  EXPECT_TRUE(IsDescendant(
      msg1,
      msg1.GetExtension(unittest::repeated_foreign_message_extension, 0)));

  EXPECT_FALSE(IsDescendant(
      msg1, msg2.GetExtension(unittest::optional_nested_message_extension)));
  EXPECT_FALSE(IsDescendant(
      msg1,
      msg2.GetExtension(unittest::repeated_foreign_message_extension, 0)));
}